

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

iterator __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
::find_in_range<std::__cxx11::string>
          (basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
           *this,range_type *r,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  iterator __lhs;
  __type _Var1;
  range_type *prVar2;
  iterator unaff_RBX;
  
  prVar2 = r;
  while( true ) {
    __lhs = prVar2->first;
    if (__lhs == (iterator)0x0) {
      return (iterator)0x0;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,k);
    if (__lhs == r->second) {
      unaff_RBX = (iterator)0x0;
    }
    if (_Var1) break;
    prVar2 = (range_type *)&__lhs->next;
    if (__lhs == r->second) {
      return unaff_RBX;
    }
  }
  return __lhs;
}

Assistant:

iterator find_in_range(range_type &r,Kt const &k)
	{
		for(iterator p=r.first;p!=0;p=p->next) {
			Equals compare;
			if(compare(p->val.first,k)) {
				return p;
			}
			if(p==r.second)
				return 0;
		}
		return 0;
	}